

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O2

void gray_render_line(gray_PWorker worker,TPos to_x,TPos to_y)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int ex;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long local_70;
  long local_68;
  
  uVar2 = worker->y;
  uVar13 = uVar2 >> 8;
  iVar12 = (int)(uVar2 >> 8);
  iVar5 = (int)((ulong)to_y >> 8);
  if ((iVar5 < worker->max_ey || iVar12 < worker->max_ey) &&
     (worker->min_ey <= iVar12 || worker->min_ey <= iVar5)) {
    uVar3 = worker->x;
    uVar11 = uVar3 >> 8;
    iVar10 = (int)(uVar3 >> 8);
    uVar7 = uVar3 + (long)iVar10 * -0x100;
    uVar14 = uVar2 + (long)iVar12 * -0x100;
    ex = (int)((ulong)to_x >> 8);
    if (iVar12 != iVar5 || iVar10 != ex) {
      if (to_y == uVar2) {
        gray_set_cell(worker,ex,iVar12);
      }
      else {
        lVar8 = to_y - uVar2;
        if (to_x == uVar3) {
          if (lVar8 < 1) {
            do {
              iVar12 = iVar12 + -1;
              worker->cover = worker->cover - (int)uVar14;
              worker->area = worker->area + (int)uVar14 * (int)uVar7 * -2;
              gray_set_cell(worker,iVar10,iVar12);
              uVar14 = 0x100;
            } while (iVar12 != iVar5);
          }
          else {
            lVar8 = 0x100 - uVar14;
            uVar14 = 0;
            do {
              iVar12 = iVar12 + 1;
              worker->cover = worker->cover + (int)lVar8;
              worker->area = worker->area + (int)lVar8 * (int)uVar7 * 2;
              gray_set_cell(worker,iVar10,iVar12);
              lVar8 = 0x100;
            } while (iVar12 != iVar5);
          }
        }
        else {
          lVar9 = to_x - uVar3;
          if (iVar10 == ex) {
            local_68 = 0;
          }
          else {
            local_68 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar9),0);
          }
          if (iVar12 == iVar5) {
            local_70 = 0;
          }
          else {
            local_70 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar8),0);
          }
          lVar6 = lVar9 * uVar14 - uVar7 * lVar8;
          do {
            lVar4 = lVar6 + lVar9 * -0x100;
            iVar10 = (int)uVar7;
            iVar12 = (int)uVar14;
            if ((lVar4 == 0 || lVar6 < lVar9 * 0x100) || 0 < lVar6) {
              lVar1 = lVar4 + lVar8 * 0x100;
              if ((lVar4 < 1) && (0 < lVar1)) {
                uVar7 = (ulong)-(local_70 * lVar4) >> 0x38;
                worker->cover = worker->cover + (0x100 - iVar12);
                worker->area = worker->area +
                               (iVar10 + (uint)(byte)((ulong)-(local_70 * lVar4) >> 0x38)) *
                               (0x100 - iVar12);
                uVar13 = (ulong)((int)uVar13 + 1);
                uVar14 = 0;
              }
              else if ((lVar1 < 1) && (lVar4 = lVar6 + lVar8 * 0x100, -1 < lVar4)) {
                uVar14 = (ulong)(lVar4 * local_68) >> 0x38;
                iVar12 = (uint)(byte)((ulong)(lVar4 * local_68) >> 0x38) - iVar12;
                worker->cover = worker->cover + iVar12;
                worker->area = worker->area + (iVar10 + 0x100) * iVar12;
                uVar11 = (ulong)((int)uVar11 + 1);
                uVar7 = 0;
              }
              else {
                uVar7 = (ulong)-(local_70 * lVar6) >> 0x38;
                worker->cover = worker->cover - iVar12;
                worker->area = worker->area -
                               (iVar10 + (uint)(byte)((ulong)-(local_70 * lVar6) >> 0x38)) * iVar12;
                lVar4 = lVar6 + lVar9 * 0x100;
                uVar13 = (ulong)((int)uVar13 - 1);
                uVar14 = 0x100;
              }
            }
            else {
              uVar14 = (ulong)(lVar6 * local_68) >> 0x38;
              iVar12 = (uint)(byte)((ulong)(lVar6 * local_68) >> 0x38) - iVar12;
              worker->cover = worker->cover + iVar12;
              worker->area = worker->area + iVar10 * iVar12;
              lVar4 = lVar6 + lVar8 * -0x100;
              uVar11 = (ulong)((int)uVar11 - 1);
              uVar7 = 0x100;
            }
            gray_set_cell(worker,(int)uVar11,(int)uVar13);
            lVar6 = lVar4;
          } while (((int)uVar11 != ex) || ((int)uVar13 != iVar5));
        }
      }
    }
    iVar5 = (int)to_y - ((int)uVar14 + iVar5 * 0x100);
    worker->cover = worker->cover + iVar5;
    worker->area = worker->area + ((int)uVar7 + ((uint)to_x & 0xff)) * iVar5;
  }
  worker->x = to_x;
  worker->y = to_y;
  return;
}

Assistant:

static void
  gray_render_line( RAS_ARG_ TPos  to_x,
                             TPos  to_y )
  {
    TPos    dx, dy, fx1, fy1, fx2, fy2;
    TCoord  ex1, ex2, ey1, ey2;


    ey1 = TRUNC( ras.y );
    ey2 = TRUNC( to_y );

    /* perform vertical clipping */
    if ( ( ey1 >= ras.max_ey && ey2 >= ras.max_ey ) ||
         ( ey1 <  ras.min_ey && ey2 <  ras.min_ey ) )
      goto End;

    ex1 = TRUNC( ras.x );
    ex2 = TRUNC( to_x );

    fx1 = ras.x - SUBPIXELS( ex1 );
    fy1 = ras.y - SUBPIXELS( ey1 );

    dx = to_x - ras.x;
    dy = to_y - ras.y;

    if ( ex1 == ex2 && ey1 == ey2 )       /* inside one cell */
      ;
    else if ( dy == 0 ) /* ex1 != ex2 */  /* any horizontal line */
    {
      ex1 = ex2;
      gray_set_cell( RAS_VAR_ ex1, ey1 );
    }
    else if ( dx == 0 )
    {
      if ( dy > 0 )                       /* vertical line up */
        do
        {
          fy2 = ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * fx1 * 2;
          fy1 = 0;
          ey1++;
          gray_set_cell( RAS_VAR_ ex1, ey1 );
        } while ( ey1 != ey2 );
      else                                /* vertical line down */
        do
        {
          fy2 = 0;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * fx1 * 2;
          fy1 = ONE_PIXEL;
          ey1--;
          gray_set_cell( RAS_VAR_ ex1, ey1 );
        } while ( ey1 != ey2 );
    }
    else                                  /* any other line */
    {
      TPos  prod = dx * fy1 - dy * fx1;
      FT_UDIVPREP( ex1 != ex2, dx );
      FT_UDIVPREP( ey1 != ey2, dy );


      /* The fundamental value `prod' determines which side and the  */
      /* exact coordinate where the line exits current cell.  It is  */
      /* also easily updated when moving from one cell to the next.  */
      do
      {
        if      ( prod                                   <= 0 &&
                  prod - dx * ONE_PIXEL                  >  0 ) /* left */
        {
          fx2 = 0;
          fy2 = (TPos)FT_UDIV( -prod, -dx );
          prod -= dy * ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = ONE_PIXEL;
          fy1 = fy2;
          ex1--;
        }
        else if ( prod - dx * ONE_PIXEL                  <= 0 &&
                  prod - dx * ONE_PIXEL + dy * ONE_PIXEL >  0 ) /* up */
        {
          prod -= dx * ONE_PIXEL;
          fx2 = (TPos)FT_UDIV( -prod, dy );
          fy2 = ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = fx2;
          fy1 = 0;
          ey1++;
        }
        else if ( prod - dx * ONE_PIXEL + dy * ONE_PIXEL <= 0 &&
                  prod                  + dy * ONE_PIXEL >= 0 ) /* right */
        {
          prod += dy * ONE_PIXEL;
          fx2 = ONE_PIXEL;
          fy2 = (TPos)FT_UDIV( prod, dx );
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = 0;
          fy1 = fy2;
          ex1++;
        }
        else /* ( prod                  + dy * ONE_PIXEL <  0 &&
                  prod                                   >  0 )    down */
        {
          fx2 = (TPos)FT_UDIV( prod, -dy );
          fy2 = 0;
          prod += dx * ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = fx2;
          fy1 = ONE_PIXEL;
          ey1--;
        }

        gray_set_cell( RAS_VAR_ ex1, ey1 );
      } while ( ex1 != ex2 || ey1 != ey2 );
    }

    fx2 = to_x - SUBPIXELS( ex2 );
    fy2 = to_y - SUBPIXELS( ey2 );

    ras.cover += ( fy2 - fy1 );
    ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );

  End:
    ras.x       = to_x;
    ras.y       = to_y;
  }